

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ld.h
# Opt level: O2

int __thiscall LdSketchWrapper<4U>::Query(LdSketchWrapper<4U> *this,Data<4U> *data,HashMap<4U> *mp)

{
  longlong lVar1;
  mapped_type *pmVar2;
  
  lVar1 = LDSketch_up_estimate(this->summary,data->str);
  pmVar2 = std::__detail::
           _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)mp,&this->up_key);
  *pmVar2 = (mapped_type)lVar1;
  lVar1 = LDSketch_low_estimate(this->summary,data->str);
  pmVar2 = std::__detail::
           _Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_int>,_std::allocator<std::pair<const_Data<4U>,_int>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)mp,&this->low_key);
  *pmVar2 = (mapped_type)lVar1;
  return 0;
}

Assistant:

int Query(const Data<DATA_LEN>& data, HashMap<DATA_LEN>& mp) {
		// estimate the frequency of data and store the estimations in mp
		unsigned char* key = (unsigned char*)(&(data.str[0]));
		mp[up_key] = LDSketch_up_estimate(summary, key);
		mp[low_key] = LDSketch_low_estimate(summary, key);
		return 0;
	}